

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O2

void __thiscall
TEST_TestRegistry_findTestWithName_Test::testBody(TEST_TestRegistry_findTestWithName_Test *this)

{
  TestRegistry *pTVar1;
  int iVar2;
  UtestShell *pUVar3;
  undefined4 extraout_var;
  TestTerminator *pTVar4;
  SimpleString local_30;
  
  UtestShell::setTestName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1)->super_UtestShell,
             "NameOfATestThatDoesExist");
  UtestShell::setTestName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2)->super_UtestShell,
             "SomeOtherTest");
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2);
  pUVar3 = UtestShell::getCurrent();
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  SimpleString::SimpleString(&local_30,"NameOfATestThatDoesExist");
  iVar2 = (*pTVar1->_vptr_TestRegistry[0x15])(pTVar1,&local_30);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(CONCAT44(extraout_var,iVar2) != 0),"CHECK",
             "myRegistry->findTestWithName(\"NameOfATestThatDoesExist\") != NULLPTR",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0xf9,pTVar4);
  SimpleString::~SimpleString(&local_30);
  return;
}

Assistant:

TEST(TestRegistry, findTestWithName)
{
    test1->setTestName("NameOfATestThatDoesExist");
    test2->setTestName("SomeOtherTest");
    myRegistry->addTest(test1);
    myRegistry->addTest(test2);
    CHECK(myRegistry->findTestWithName("NameOfATestThatDoesExist") != NULLPTR);
}